

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

int mpc_parse_run(mpc_input_t *i,mpc_parser_t *p,mpc_result_t *r,mpc_err_t **e,int depth)

{
  char cVar1;
  mpc_apply_t p_Var2;
  mpc_ctor_t p_Var3;
  undefined4 uVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  mpc_err_t *pmVar9;
  void *pvVar10;
  mpc_result_t mVar11;
  mpc_result_t *xs;
  mpc_ast_t *pmVar12;
  undefined4 extraout_var;
  size_t sVar13;
  undefined4 extraout_var_00;
  mpc_val_t *pmVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  mpc_result_t *pmVar18;
  char *pcVar19;
  mpc_input_t *pmVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  mpc_ctor_t p_Var24;
  ulong uVar25;
  long lVar26;
  uint local_84;
  mpc_result_t results_stk [4];
  
  if (depth == 1000) {
    pcVar19 = "Maximum recursion depth exceeded!";
    goto LAB_00101c9b;
  }
  switch(p->type) {
  case '\0':
    pcVar19 = "Parser Undefined!";
    goto LAB_00101c9b;
  case '\x01':
    goto switchD_00101cd8_caseD_1;
  case '\x02':
    pcVar19 = (char *)(p->data).lift.lf;
    goto LAB_00101c9b;
  case '\x03':
    mVar11.output = (*(p->data).lift.lf)();
    goto LAB_001025a7;
  case '\x04':
    mVar11 = (mpc_result_t)(p->data).lift.x;
    goto LAB_001025a7;
  case '\x05':
    i->suppress = i->suppress + 1;
    iVar8 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    i->suppress = i->suppress + -1;
    if (iVar8 != 0) {
      return 1;
    }
    pcVar19 = (p->data).expect.m;
    goto LAB_0010228f;
  case '\x06':
    p_Var3 = (p->data).lift.lf;
    r->error = (mpc_err_t *)0x0;
    cVar5 = i->last;
    cVar6 = mpc_input_peekc(i);
    pmVar14 = (*p_Var3)((ulong)(uint)(int)cVar5,(ulong)(uint)(int)cVar6);
    iVar8 = (int)pmVar14;
    goto LAB_00102234;
  case '\a':
    mVar11.output = mpc_malloc(i,0x20);
    lVar17 = (i->state).row;
    lVar26 = (i->state).col;
    iVar8 = (i->state).term;
    uVar4 = *(undefined4 *)&(i->state).field_0x1c;
    ((mVar11.error)->state).pos = (i->state).pos;
    ((mVar11.error)->state).row = lVar17;
    ((mVar11.error)->state).col = lVar26;
    ((mpc_state_t *)mVar11)->term = iVar8;
    *(undefined4 *)&((mpc_state_t *)mVar11)->field_0x1c = uVar4;
    goto LAB_001025a7;
  case '\b':
    iVar8 = mpc_input_terminated(i);
    if (iVar8 == 0) {
      cVar5 = mpc_input_getc(i);
LAB_001022f3:
      mpc_input_success(i,cVar5,(char **)&r->error);
      return 1;
    }
    goto LAB_001023a9;
  case '\t':
    iVar8 = mpc_input_char(i,(p->data).range.x,(char **)&r->error);
LAB_00102234:
    if (iVar8 != 0) {
      return 1;
    }
    goto LAB_001023a9;
  case '\n':
    p_Var3 = (p->data).lift.lf;
    iVar8 = mpc_input_terminated(i);
    if (iVar8 != 0) goto LAB_001023a9;
    cVar5 = mpc_input_getc(i);
    pcVar19 = strchr((char *)p_Var3,(int)cVar5);
    if (pcVar19 != (char *)0x0) goto LAB_001022f3;
    break;
  case '\v':
    p_Var3 = (p->data).lift.lf;
    iVar8 = mpc_input_terminated(i);
    if (iVar8 != 0) goto LAB_001023a9;
    cVar5 = mpc_input_getc(i);
    pcVar19 = strchr((char *)p_Var3,(int)cVar5);
    if (pcVar19 == (char *)0x0) goto LAB_001022f3;
    break;
  case '\f':
    cVar6 = (p->data).range.x;
    cVar1 = (p->data).range.y;
    iVar8 = mpc_input_terminated(i);
    if (iVar8 != 0) goto LAB_001023a9;
    cVar5 = mpc_input_getc(i);
    if ((cVar6 <= cVar5) && (cVar5 <= cVar1)) goto LAB_001022f3;
    break;
  case '\r':
    p_Var3 = (p->data).lift.lf;
    iVar8 = mpc_input_terminated(i);
    if (iVar8 != 0) goto LAB_001023a9;
    cVar5 = mpc_input_getc(i);
    pmVar14 = (*p_Var3)((ulong)(uint)(int)cVar5);
    if ((int)pmVar14 != 0) goto LAB_001022f3;
    break;
  case '\x0e':
    p_Var3 = (p->data).lift.lf;
    mpc_input_mark(i);
    p_Var24 = p_Var3;
    do {
      if (*p_Var24 == (_func_mpc_val_t_ptr)0x0) {
        mpc_input_unmark(i);
        sVar13 = strlen((char *)p_Var3);
        pcVar19 = (char *)mpc_malloc(i,sVar13 + 1);
        r->output = pcVar19;
        strcpy(pcVar19,(char *)p_Var3);
        return 1;
      }
      iVar8 = mpc_input_char(i,(char)*p_Var24,(char **)0x0);
      p_Var24 = p_Var24 + 1;
    } while (iVar8 != 0);
    mpc_input_rewind(i);
    goto LAB_001023a9;
  case '\x0f':
    iVar8 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar8 == 0) {
      return 0;
    }
    p_Var2 = (p->data).apply.f;
    pcVar19 = (char *)r->output;
    if (p_Var2 == mpcf_free) {
      mpc_free(i,pcVar19);
      pmVar12 = (mpc_ast_t *)0x0;
    }
    else if (p_Var2 == mpcf_str_ast) {
      pmVar12 = mpc_ast_new("",pcVar19);
      mpc_free(i,pcVar19);
    }
    else {
      pvVar10 = mpc_export(i,pcVar19);
      pmVar12 = (mpc_ast_t *)(*p_Var2)(pvVar10);
    }
    r->output = pmVar12;
    return 1;
  case '\x10':
    iVar8 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar8 == 0) {
      return 0;
    }
    p_Var2 = (p->data).apply.f;
    pvVar10 = mpc_export(i,r->output);
    mVar11.output = (*p_Var2)(pvVar10);
LAB_001025a7:
    *r = mVar11;
    return 1;
  case '\x11':
    i->backtrack = i->backtrack + -1;
    iVar8 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    i->backtrack = i->backtrack + 1;
    return iVar8;
  case '\x12':
    mpc_input_mark(i);
    i->suppress = i->suppress + 1;
    iVar8 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar8 == 0) {
      pmVar20 = i;
      mpc_input_unmark(i);
      i->suppress = i->suppress + -1;
      mVar11._0_4_ = (*(p->data).check.f)((mpc_val_t **)pmVar20);
      mVar11._4_4_ = extraout_var_00;
      goto LAB_001025a7;
    }
    mpc_input_rewind(i);
    i->suppress = i->suppress + -1;
    mpc_parse_dtor(i,(p->data).check.dx,r->output);
    pcVar19 = "opposite";
LAB_0010228f:
    pmVar9 = mpc_err_new(i,pcVar19);
    goto LAB_00101ca3;
  case '\x13':
    iVar7 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    iVar8 = 1;
    if (iVar7 != 0) {
      return 1;
    }
    pmVar9 = mpc_err_merge(i,*e,r->error);
    *e = pmVar9;
    iVar7 = (*(p->data).check.f)((mpc_val_t **)i);
    pmVar9 = (mpc_err_t *)CONCAT44(extraout_var,iVar7);
    goto LAB_0010240f;
  case '\x14':
    local_84 = 4;
    xs = results_stk;
    uVar22 = 0;
    do {
      uVar16 = uVar22 & 0xffffffff;
      lVar26 = 0;
      lVar17 = 0;
      do {
        lVar15 = lVar17;
        iVar8 = mpc_parse_run(i,(p->data).repeat.x,(mpc_result_t *)((long)xs + lVar26 + uVar22 * 8),
                              e,depth + 1);
        if (iVar8 == 0) {
          uVar16 = uVar22 + lVar15;
          pmVar9 = mpc_err_merge(i,*e,xs[uVar22 + lVar15].error);
          *e = pmVar9;
          pmVar14 = mpc_parse_fold(i,(p->data).repeat.f,(int)uVar16,&xs->output);
          r->output = pmVar14;
joined_r0x001021ca:
          iVar7 = 1;
          if (uVar16 < 4) {
            return 1;
          }
          goto LAB_00102758;
        }
        if (lVar15 + uVar22 == 3) {
          xs = (mpc_result_t *)mpc_malloc(i,0x30);
          *xs = results_stk[0];
          xs[1] = results_stk[1];
          xs[2] = results_stk[2];
          xs[3] = results_stk[3];
          local_84 = 6;
          goto LAB_00102002;
        }
        iVar8 = (int)(lVar15 + 1);
        lVar26 = lVar26 + 8;
        uVar23 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar23;
        lVar17 = lVar15 + 1;
      } while (iVar8 + (int)uVar22 < (int)local_84);
      local_84 = iVar8 + (int)uVar22 + (uVar23 >> 1);
      xs = (mpc_result_t *)mpc_realloc(i,xs,(ulong)local_84 * 8);
LAB_00102002:
      uVar22 = uVar22 + lVar15 + 1;
    } while( true );
  case '\x15':
    local_84 = 4;
    xs = results_stk;
    uVar22 = 0;
    do {
      iVar8 = (int)uVar22;
      uVar16 = uVar22 & 0xffffffff;
      lVar26 = 0;
      lVar17 = 0;
      do {
        lVar15 = lVar17;
        iVar7 = mpc_parse_run(i,(p->data).repeat.x,(mpc_result_t *)((long)xs + lVar26 + uVar22 * 8),
                              e,depth + 1);
        if (iVar7 == 0) {
          uVar16 = uVar22 + lVar15;
          if (uVar16 == 0) {
            pmVar9 = mpc_err_repeat(i,xs[uVar22 + lVar15].error,"one or more of ");
            r->error = pmVar9;
            return 0;
          }
          pmVar9 = mpc_err_merge(i,*e,xs[uVar22 + lVar15].error);
          *e = pmVar9;
          pmVar14 = mpc_parse_fold(i,(p->data).repeat.f,iVar8 + (int)lVar15,&xs->output);
          r->output = pmVar14;
          goto joined_r0x001021ca;
        }
        if (lVar15 + uVar22 == 3) {
          xs = (mpc_result_t *)mpc_malloc(i,0x30);
          *xs = results_stk[0];
          xs[1] = results_stk[1];
          xs[2] = results_stk[2];
          xs[3] = results_stk[3];
          local_84 = 6;
          goto LAB_00102164;
        }
        iVar7 = (int)(lVar15 + 1);
        lVar26 = lVar26 + 8;
        uVar23 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar23;
        lVar17 = lVar15 + 1;
      } while (iVar7 + iVar8 < (int)local_84);
      local_84 = iVar7 + iVar8 + (uVar23 >> 1);
      xs = (mpc_result_t *)mpc_realloc(i,xs,(ulong)local_84 * 8);
LAB_00102164:
      uVar22 = uVar22 + lVar15 + 1;
    } while( true );
  case '\x16':
    lVar17 = (long)(p->data).repeat.n;
    if (lVar17 < 5) {
      xs = results_stk;
    }
    else {
      xs = (mpc_result_t *)mpc_malloc(i,lVar17 << 3);
    }
    uVar22 = 0;
    pmVar18 = xs;
    do {
      iVar8 = mpc_parse_run(i,(p->data).repeat.x,pmVar18,e,depth + 1);
      uVar23 = (p->data).repeat.n;
      if (iVar8 == 0) break;
      uVar22 = uVar22 + 1;
      pmVar18 = pmVar18 + 1;
    } while (uVar22 != uVar23);
    uVar21 = (uint)uVar22;
    if (uVar23 == uVar21) {
      pmVar14 = mpc_parse_fold(i,(p->data).repeat.f,uVar23,&xs->output);
      r->output = pmVar14;
      iVar7 = 1;
      iVar8 = (p->data).repeat.n;
    }
    else {
      uVar16 = 0;
      uVar25 = 0;
      if (0 < (int)uVar21) {
        uVar25 = uVar22 & 0xffffffff;
      }
      for (; uVar25 != uVar16; uVar16 = uVar16 + 1) {
        mpc_parse_dtor(i,(p->data).repeat.dx,xs[uVar16].output);
      }
      pmVar9 = xs[(int)uVar21].error;
      uVar23 = (p->data).repeat.n;
      pcVar19 = (char *)mpc_malloc(i,(long)((int)uVar23 / 10 + 6));
      iVar7 = 0;
      sprintf(pcVar19,"%i of ",(ulong)uVar23);
      pmVar9 = mpc_err_repeat(i,pmVar9,pcVar19);
      mpc_free(i,pcVar19);
      r->error = pmVar9;
      iVar8 = (p->data).repeat.n;
    }
joined_r0x00102728:
    if (iVar8 < 5) {
      return iVar7;
    }
LAB_00102758:
    mpc_free(i,xs);
    return iVar7;
  case '\x17':
    uVar23 = (p->data).repeat.n;
    if ((ulong)uVar23 != 0) {
      if ((int)uVar23 < 5) {
        xs = results_stk;
      }
      else {
        xs = (mpc_result_t *)mpc_malloc(i,(ulong)uVar23 << 3);
      }
      pmVar18 = xs;
      for (lVar17 = 0; lVar17 < (p->data).repeat.n; lVar17 = lVar17 + 1) {
        iVar8 = mpc_parse_run(i,*(mpc_parser_t **)((long)(p->data).lift.x + lVar17 * 8),pmVar18,e,
                              depth + 1);
        if (iVar8 != 0) {
          r->error = (mpc_err_t *)*(mpc_err_t **)pmVar18;
          iVar7 = 1;
          iVar8 = (p->data).repeat.n;
          goto joined_r0x00102728;
        }
        pmVar9 = mpc_err_merge(i,*e,pmVar18->error);
        *e = pmVar9;
        pmVar18 = pmVar18 + 1;
      }
      r->error = (mpc_err_t *)0x0;
      iVar7 = 0;
      iVar8 = (p->data).repeat.n;
      goto joined_r0x00102728;
    }
    goto switchD_00101cd8_caseD_1;
  case '\x18':
    uVar23 = (p->data).repeat.n;
    if ((ulong)uVar23 != 0) {
      if ((int)uVar23 < 5) {
        xs = results_stk;
      }
      else {
        xs = (mpc_result_t *)mpc_malloc(i,(ulong)uVar23 << 3);
      }
      mpc_input_mark(i);
      for (lVar17 = 0; lVar17 < (p->data).repeat.n; lVar17 = lVar17 + 1) {
        iVar8 = mpc_parse_run(i,*(mpc_parser_t **)((long)(p->data).apply_to.d + lVar17 * 8),
                              xs + lVar17,e,depth + 1);
        if (iVar8 == 0) {
          mpc_input_rewind(i);
          for (lVar26 = 0; lVar17 != lVar26; lVar26 = lVar26 + 1) {
            mpc_parse_dtor(i,*(mpc_dtor_t *)((p->data).check.e + lVar26 * 8),xs[lVar26].output);
          }
          *r = xs[lVar17];
          iVar7 = 0;
          iVar8 = (p->data).repeat.n;
          goto joined_r0x00102728;
        }
      }
      mpc_input_unmark(i);
      pmVar14 = mpc_parse_fold(i,(p->data).repeat.f,(int)lVar17,&xs->output);
      r->output = pmVar14;
      iVar7 = 1;
      iVar8 = (p->data).repeat.n;
      goto joined_r0x00102728;
    }
switchD_00101cd8_caseD_1:
    r->error = (mpc_err_t *)0x0;
    return 1;
  case '\x19':
    iVar8 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar8 == 0) {
      return 0;
    }
    iVar8 = (*(p->data).check.f)(&r->output);
    if (iVar8 != 0) {
      return 1;
    }
    mpc_parse_dtor(i,(p->data).check.dx,r->output);
    pcVar19 = (p->data).check.e;
    goto LAB_00102407;
  case '\x1a':
    iVar8 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar8 == 0) {
      return 0;
    }
    iVar8 = (*(p->data).check.f)(&r->output);
    if (iVar8 != 0) {
      return 1;
    }
    mpc_parse_dtor(i,(p->data).check.dx,r->output);
    pcVar19 = (p->data).check_with.e;
LAB_00102407:
    iVar8 = 0;
    pmVar9 = mpc_err_fail(i,pcVar19);
LAB_0010240f:
    r->error = pmVar9;
    return iVar8;
  case '\x1b':
    cVar5 = i->last;
    r->error = (mpc_err_t *)0x0;
    return (uint)(cVar5 == '\0');
  case '\x1c':
    r->error = (mpc_err_t *)0x0;
    if (((i->state).term == 0) && (iVar8 = mpc_input_terminated(i), iVar8 != 0)) {
      (i->state).term = 1;
      return 1;
    }
    goto LAB_001023a9;
  default:
    pcVar19 = "Unknown Parser Type Id!";
LAB_00101c9b:
    pmVar9 = mpc_err_fail(i,pcVar19);
LAB_00101ca3:
    r->error = pmVar9;
    return 0;
  }
  mpc_input_failure(i,cVar5);
LAB_001023a9:
  r->error = (mpc_err_t *)0x0;
  return 0;
}

Assistant:

static int mpc_parse_run(mpc_input_t *i, mpc_parser_t *p, mpc_result_t *r, mpc_err_t **e, int depth) {

  int j = 0, k = 0;
  mpc_result_t results_stk[MPC_PARSE_STACK_MIN];
  mpc_result_t *results;
  int results_slots = MPC_PARSE_STACK_MIN;

  if (depth == MPC_MAX_RECURSION_DEPTH)
  {
    MPC_FAILURE(mpc_err_fail(i, "Maximum recursion depth exceeded!"));
  }

  switch (p->type) {

    /* Basic Parsers */

    case MPC_TYPE_ANY:     MPC_PRIMITIVE(mpc_input_any(i, (char**)&r->output));
    case MPC_TYPE_SINGLE:  MPC_PRIMITIVE(mpc_input_char(i, p->data.single.x, (char**)&r->output));
    case MPC_TYPE_RANGE:   MPC_PRIMITIVE(mpc_input_range(i, p->data.range.x, p->data.range.y, (char**)&r->output));
    case MPC_TYPE_ONEOF:   MPC_PRIMITIVE(mpc_input_oneof(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_NONEOF:  MPC_PRIMITIVE(mpc_input_noneof(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_SATISFY: MPC_PRIMITIVE(mpc_input_satisfy(i, p->data.satisfy.f, (char**)&r->output));
    case MPC_TYPE_STRING:  MPC_PRIMITIVE(mpc_input_string(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_ANCHOR:  MPC_PRIMITIVE(mpc_input_anchor(i, p->data.anchor.f, (char**)&r->output));
    case MPC_TYPE_SOI:     MPC_PRIMITIVE(mpc_input_soi(i, (char**)&r->output));
    case MPC_TYPE_EOI:     MPC_PRIMITIVE(mpc_input_eoi(i, (char**)&r->output));

    /* Other parsers */

    case MPC_TYPE_UNDEFINED: MPC_FAILURE(mpc_err_fail(i, "Parser Undefined!"));
    case MPC_TYPE_PASS:      MPC_SUCCESS(NULL);
    case MPC_TYPE_FAIL:      MPC_FAILURE(mpc_err_fail(i, p->data.fail.m));
    case MPC_TYPE_LIFT:      MPC_SUCCESS(p->data.lift.lf());
    case MPC_TYPE_LIFT_VAL:  MPC_SUCCESS(p->data.lift.x);
    case MPC_TYPE_STATE:     MPC_SUCCESS(mpc_input_state_copy(i));

    /* Application Parsers */

    case MPC_TYPE_APPLY:
      if (mpc_parse_run(i, p->data.apply.x, r, e, depth+1)) {
        MPC_SUCCESS(mpc_parse_apply(i, p->data.apply.f, r->output));
      } else {
        MPC_FAILURE(r->output);
      }

    case MPC_TYPE_APPLY_TO:
      if (mpc_parse_run(i, p->data.apply_to.x, r, e, depth+1)) {
        MPC_SUCCESS(mpc_parse_apply_to(i, p->data.apply_to.f, r->output, p->data.apply_to.d));
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_CHECK:
      if (mpc_parse_run(i, p->data.check.x, r, e, depth+1)) {
        if (p->data.check.f(&r->output)) {
          MPC_SUCCESS(r->output);
        } else {
          mpc_parse_dtor(i, p->data.check.dx, r->output);
          MPC_FAILURE(mpc_err_fail(i, p->data.check.e));
        }
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_CHECK_WITH:
      if (mpc_parse_run(i, p->data.check_with.x, r, e, depth+1)) {
        if (p->data.check_with.f(&r->output, p->data.check_with.d)) {
          MPC_SUCCESS(r->output);
        } else {
          mpc_parse_dtor(i, p->data.check.dx, r->output);
          MPC_FAILURE(mpc_err_fail(i, p->data.check_with.e));
        }
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_EXPECT:
      mpc_input_suppress_enable(i);
      if (mpc_parse_run(i, p->data.expect.x, r, e, depth+1)) {
        mpc_input_suppress_disable(i);
        MPC_SUCCESS(r->output);
      } else {
        mpc_input_suppress_disable(i);
        MPC_FAILURE(mpc_err_new(i, p->data.expect.m));
      }

    case MPC_TYPE_PREDICT:
      mpc_input_backtrack_disable(i);
      if (mpc_parse_run(i, p->data.predict.x, r, e, depth+1)) {
        mpc_input_backtrack_enable(i);
        MPC_SUCCESS(r->output);
      } else {
        mpc_input_backtrack_enable(i);
        MPC_FAILURE(r->error);
      }

    /* Optional Parsers */

    /* TODO: Update Not Error Message */

    case MPC_TYPE_NOT:
      mpc_input_mark(i);
      mpc_input_suppress_enable(i);
      if (mpc_parse_run(i, p->data.not.x, r, e, depth+1)) {
        mpc_input_rewind(i);
        mpc_input_suppress_disable(i);
        mpc_parse_dtor(i, p->data.not.dx, r->output);
        MPC_FAILURE(mpc_err_new(i, "opposite"));
      } else {
        mpc_input_unmark(i);
        mpc_input_suppress_disable(i);
        MPC_SUCCESS(p->data.not.lf());
      }

    case MPC_TYPE_MAYBE:
      if (mpc_parse_run(i, p->data.not.x, r, e, depth+1)) {
        MPC_SUCCESS(r->output);
      } else {
        *e = mpc_err_merge(i, *e, r->error);
        MPC_SUCCESS(p->data.not.lf());
      }

    /* Repeat Parsers */

    case MPC_TYPE_MANY:

      results = results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == MPC_PARSE_STACK_MIN) {
          results_slots = j + j / 2;
          results = mpc_malloc(i, sizeof(mpc_result_t) * results_slots);
          memcpy(results, results_stk, sizeof(mpc_result_t) * MPC_PARSE_STACK_MIN);
        } else if (j >= results_slots) {
          results_slots = j + j / 2;
          results = mpc_realloc(i, results, sizeof(mpc_result_t) * results_slots);
        }
      }

      *e = mpc_err_merge(i, *e, results[j].error);

      MPC_SUCCESS(
        mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
        if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    case MPC_TYPE_MANY1:

      results = results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == MPC_PARSE_STACK_MIN) {
          results_slots = j + j / 2;
          results = mpc_malloc(i, sizeof(mpc_result_t) * results_slots);
          memcpy(results, results_stk, sizeof(mpc_result_t) * MPC_PARSE_STACK_MIN);
        } else if (j >= results_slots) {
          results_slots = j + j / 2;
          results = mpc_realloc(i, results, sizeof(mpc_result_t) * results_slots);
        }
      }

      if (j == 0) {
        MPC_FAILURE(
          mpc_err_many1(i, results[j].error);
          if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      } else {

        *e = mpc_err_merge(i, *e, results[j].error);

        MPC_SUCCESS(
          mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
          if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      }

    case MPC_TYPE_COUNT:

      results = p->data.repeat.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.repeat.n)
        : results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == p->data.repeat.n) { break; }
      }

      if (j == p->data.repeat.n) {
        MPC_SUCCESS(
          mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
          if (p->data.repeat.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      } else {
        for (k = 0; k < j; k++) {
          mpc_parse_dtor(i, p->data.repeat.dx, results[k].output);
        }
        MPC_FAILURE(
          mpc_err_count(i, results[j].error, p->data.repeat.n);
          if (p->data.repeat.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      }

    /* Combinatory Parsers */

    case MPC_TYPE_OR:

      if (p->data.or.n == 0) { MPC_SUCCESS(NULL); }

      results = p->data.or.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.or.n)
        : results_stk;

      for (j = 0; j < p->data.or.n; j++) {
        if (mpc_parse_run(i, p->data.or.xs[j], &results[j], e, depth+1)) {
          MPC_SUCCESS(results[j].output;
            if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
        } else {
          *e = mpc_err_merge(i, *e, results[j].error);
        }
      }

      MPC_FAILURE(NULL;
        if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    case MPC_TYPE_AND:

      if (p->data.and.n == 0) { MPC_SUCCESS(NULL); }

      results = p->data.or.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.or.n)
        : results_stk;

      mpc_input_mark(i);
      for (j = 0; j < p->data.and.n; j++) {
        if (!mpc_parse_run(i, p->data.and.xs[j], &results[j], e, depth+1)) {
          mpc_input_rewind(i);
          for (k = 0; k < j; k++) {
            mpc_parse_dtor(i, p->data.and.dxs[k], results[k].output);
          }
          MPC_FAILURE(results[j].error;
            if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
        }
      }
      mpc_input_unmark(i);
      MPC_SUCCESS(
        mpc_parse_fold(i, p->data.and.f, j, (mpc_val_t**)results);
        if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    /* End */

    default:

      MPC_FAILURE(mpc_err_fail(i, "Unknown Parser Type Id!"));
  }

  return 0;

}